

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddRgEa<(moira::Instr)118,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 addr;
  u32 uVar2;
  bool bVar3;
  ulong uVar4;
  
  addr = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)1,128ul>(this,addr);
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  uVar4 = (ulong)uVar2 - (ulong)(uVar1 & 0xff);
  bVar3 = (bool)((byte)(uVar4 >> 8) & 1);
  (this->reg).sr.c = bVar3;
  (this->reg).sr.x = bVar3;
  (this->reg).sr.v = (bool)((byte)(((byte)uVar2 ^ (byte)uVar4) & ((byte)uVar1 ^ (byte)uVar2)) >> 7);
  (this->reg).sr.z = (byte)uVar4 == 0;
  (this->reg).sr.n = (bool)((byte)((uVar4 & 0xffffffff) >> 7) & 1);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,(u32)uVar4);
  return;
}

Assistant:

void
Moira::execAddRgEa(u16 opcode)
{
    u32 ea, data, result;

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    result = addsub<I,S>(readD<S>(src), data);

    prefetch();
    writeM <M, S, POLLIPL> (ea, result);
}